

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVariableWithScalars
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *interface_var_type,uint32_t location,uint32_t component,
          uint32_t extra_array_length)

{
  StorageClass storage_class;
  uint32_t var_id;
  IRContext *this_00;
  undefined1 local_58 [8];
  NestedCompositeComponents scalar_interface_vars;
  uint32_t extra_array_length_local;
  uint32_t component_local;
  uint32_t location_local;
  Instruction *interface_var_type_local;
  Instruction *interface_var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  scalar_interface_vars.component_variable._4_4_ = extra_array_length;
  extra_array_length_local = location;
  _component_local = interface_var_type;
  interface_var_type_local = interface_var;
  interface_var_local = (Instruction *)this;
  storage_class = anon_unknown_0::GetStorageClass(interface_var);
  CreateScalarInterfaceVarsForReplacement
            ((NestedCompositeComponents *)local_58,this,interface_var_type,storage_class,
             scalar_interface_vars.component_variable._4_4_);
  AddLocationAndComponentDecorations
            (this,(NestedCompositeComponents *)local_58,&extra_array_length_local,component);
  var_id = opt::Instruction::result_id(interface_var_type_local);
  KillLocationAndComponentDecorations(this,var_id);
  this_local._7_1_ =
       ReplaceInterfaceVarWith
                 (this,interface_var_type_local,scalar_interface_vars.component_variable._4_4_,
                  (NestedCompositeComponents *)local_58);
  if ((bool)this_local._7_1_) {
    this_00 = Pass::context(&this->super_Pass);
    IRContext::KillInst(this_00,interface_var_type_local);
  }
  NestedCompositeComponents::~NestedCompositeComponents((NestedCompositeComponents *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVariableWithScalars(
    Instruction* interface_var, Instruction* interface_var_type,
    uint32_t location, uint32_t component, uint32_t extra_array_length) {
  NestedCompositeComponents scalar_interface_vars =
      CreateScalarInterfaceVarsForReplacement(interface_var_type,
                                              GetStorageClass(interface_var),
                                              extra_array_length);

  AddLocationAndComponentDecorations(scalar_interface_vars, &location,
                                     component);
  KillLocationAndComponentDecorations(interface_var->result_id());

  if (!ReplaceInterfaceVarWith(interface_var, extra_array_length,
                               scalar_interface_vars)) {
    return false;
  }

  context()->KillInst(interface_var);
  return true;
}